

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O0

void rlogin_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,int error_code)

{
  SeatPromptResult spr;
  prompts_t *ppVar1;
  char *pcVar2;
  SeatPromptResult local_68;
  char *local_48;
  char *ruser;
  Rlogin *rlogin;
  char *pcStack_30;
  int error_code_local;
  char *error_msg_local;
  SockAddr *pSStack_20;
  int port_local;
  SockAddr *addr_local;
  Plug *pPStack_10;
  PlugLogType type_local;
  Plug *plug_local;
  
  ruser = (char *)(plug + -10);
  rlogin._4_4_ = error_code;
  pcStack_30 = error_msg;
  error_msg_local._4_4_ = port;
  pSStack_20 = addr;
  addr_local._4_4_ = type;
  pPStack_10 = plug;
  backend_socket_log((Seat *)plug[-6].vt,(LogContext *)plug[-5].vt,type,addr,port,error_msg,
                     error_code,(Conf *)plug[-2].vt,(_Bool)(*(byte *)&plug[-8].vt & 1));
  if (addr_local._4_4_ == PLUGLOG_CONNECT_SUCCESS) {
    ruser[0x10] = '\x01';
    local_48 = get_remote_username(*(Conf **)(ruser + 0x40));
    if (local_48 == (char *)0x0) {
      ppVar1 = new_prompts();
      *(prompts_t **)(ruser + 0x48) = ppVar1;
      **(undefined1 **)(ruser + 0x48) = 1;
      *(undefined1 *)(*(long *)(ruser + 0x48) + 1) = 0;
      pcVar2 = dupstr("Rlogin login name");
      *(char **)(*(long *)(ruser + 0x48) + 8) = pcVar2;
      *(code **)(*(long *)(ruser + 0x48) + 0x68) = rlogin_try_username_prompt;
      *(char **)(*(long *)(ruser + 0x48) + 0x70) = ruser;
      ppVar1 = *(prompts_t **)(ruser + 0x48);
      pcVar2 = dupstr("rlogin username: ");
      add_prompt(ppVar1,pcVar2,true);
      rlogin_try_username_prompt(ruser);
    }
    else {
      seat_set_trust_status(*(Seat **)(ruser + 0x20),false);
      pcVar2 = ruser;
      make_spr_simple(&local_68,SPRK_OK);
      spr.errfn = local_68.errfn;
      spr.kind = local_68.kind;
      spr._4_4_ = local_68._4_4_;
      spr.errdata_lit._0_4_ = (int)local_68.errdata_lit;
      spr.errdata_lit._4_4_ = (int)((ulong)local_68.errdata_lit >> 0x20);
      spr.errdata_u = local_68.errdata_u;
      spr._28_4_ = local_68._28_4_;
      rlogin_startup((Rlogin *)pcVar2,spr,local_48);
      safefree(local_48);
    }
  }
  return;
}

Assistant:

static void rlogin_log(Plug *plug, PlugLogType type, SockAddr *addr, int port,
                       const char *error_msg, int error_code)
{
    Rlogin *rlogin = container_of(plug, Rlogin, plug);
    backend_socket_log(rlogin->seat, rlogin->logctx, type, addr, port,
                       error_msg, error_code,
                       rlogin->conf, rlogin->socket_connected);
    if (type == PLUGLOG_CONNECT_SUCCESS) {
        rlogin->socket_connected = true;

        char *ruser = get_remote_username(rlogin->conf);
        if (ruser) {
            /*
             * If we already know the remote username, call
             * rlogin_startup, which will send the initial protocol
             * greeting including local username, remote username,
             * terminal type and terminal speed.
             */
            /* Next terminal output will come from server */
            seat_set_trust_status(rlogin->seat, false);
            rlogin_startup(rlogin, SPR_OK, ruser);
            sfree(ruser);
        } else {
            /*
             * Otherwise, set up a prompts_t asking for the local
             * username. If it completes synchronously, call
             * rlogin_startup as above; otherwise, wait until it does.
             */
            rlogin->prompt = new_prompts();
            rlogin->prompt->to_server = true;
            rlogin->prompt->from_server = false;
            rlogin->prompt->name = dupstr("Rlogin login name");
            rlogin->prompt->callback = rlogin_try_username_prompt;
            rlogin->prompt->callback_ctx = rlogin;
            add_prompt(rlogin->prompt, dupstr("rlogin username: "), true);
            rlogin_try_username_prompt(rlogin);
        }
    }
}